

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::setFlags(QTreeWidgetItem *this,ItemFlags flags)

{
  byte bVar1;
  QTreeWidgetItem *pQVar2;
  bool bVar3;
  Int IVar4;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar5;
  QFlags<Qt::ItemFlag> QVar6;
  QTreeWidgetItem *pQVar7;
  qsizetype qVar8;
  const_reference ppQVar9;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  int i;
  QTreeWidgetItem *parent;
  bool changedExplicit;
  bool changedState;
  bool enable;
  QTreeWidgetItem *child;
  QStack<QTreeWidgetItem_*> parents;
  undefined4 in_stack_ffffffffffffff78;
  ItemFlag in_stack_ffffffffffffff7c;
  QTreeWidgetItem *in_stack_ffffffffffffff80;
  bool local_6d;
  int local_6c;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_18;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_14;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  local_10.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  bVar10 = IVar4 != 0;
  local_14.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  bVar1 = *(byte *)(*(long *)(in_RDI + 0x30) + 0x20);
  *(byte *)(*(long *)(in_RDI + 0x30) + 0x20) =
       *(byte *)(*(long *)(in_RDI + 0x30) + 0x20) & 0xfe | (bVar10 ^ 0xffU) & 1;
  local_6d = false;
  if ((bVar10) && (local_6d = false, *(long *)(in_RDI + 0x38) != 0)) {
    local_18.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_6d = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_18);
  }
  if (local_6d == false) {
    *(undefined4 *)(in_RDI + 0x58) = local_c;
  }
  else {
    QVar5.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    ((QFlagsStorageHelper<Qt::ItemFlag,_4> *)(in_RDI + 0x58))->super_QFlagsStorage<Qt::ItemFlag> =
         QVar5.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  if (((IVar4 != 0) != bVar10) && ((bool)(bVar1 & 1) != !bVar10)) {
    QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x91420e);
    QStack<QTreeWidgetItem_*>::push
              ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff80,
               (QTreeWidgetItem **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    while (bVar3 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x914231),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      pQVar7 = QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x914246);
      local_6c = 0;
      while( true ) {
        in_stack_ffffffffffffff80 = (QTreeWidgetItem *)(long)local_6c;
        qVar8 = QList<QTreeWidgetItem_*>::size(&pQVar7->children);
        if (qVar8 <= (long)in_stack_ffffffffffffff80) break;
        ppQVar9 = QList<QTreeWidgetItem_*>::at
                            ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff80,
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        pQVar2 = *ppQVar9;
        if ((pQVar2->d->field_0x20 & 1) == 0) {
          QStack<QTreeWidgetItem_*>::push
                    ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff80,
                     (QTreeWidgetItem **)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (bVar10) {
            QVar6 = QFlags<Qt::ItemFlag>::operator|
                              ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff7c);
            (pQVar2->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
            super_QFlagsStorage<Qt::ItemFlag>.i =
                 (Int)QVar6.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                      super_QFlagsStorage<Qt::ItemFlag>.i;
          }
          else {
            QVar6 = QFlags<Qt::ItemFlag>::operator&
                              ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff7c);
            (pQVar2->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
            super_QFlagsStorage<Qt::ItemFlag>.i =
                 (Int)QVar6.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                      super_QFlagsStorage<Qt::ItemFlag>.i;
          }
          itemChanged(in_stack_ffffffffffffff80);
        }
        local_6c = local_6c + 1;
      }
    }
    QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x914336);
  }
  itemChanged(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setFlags(Qt::ItemFlags flags)
{
    const bool enable = (flags & Qt::ItemIsEnabled);
    const bool changedState = bool(itemFlags & Qt::ItemIsEnabled) != enable;
    const bool changedExplicit = d->disabled != !enable;

    d->disabled = !enable;

    if (enable && par && !(par->itemFlags & Qt::ItemIsEnabled)) // inherit from parent
        itemFlags = flags & ~Qt::ItemIsEnabled;
    else // this item is explicitly disabled or has no parent
        itemFlags = flags;

    if (changedState && changedExplicit) { // if the propagate the change to the children
        QStack<QTreeWidgetItem*> parents;
        parents.push(this);
        while (!parents.isEmpty()) {
            QTreeWidgetItem *parent = parents.pop();
            for (int i = 0; i < parent->children.size(); ++i) {
                QTreeWidgetItem *child = parent->children.at(i);
                if (!child->d->disabled) { // if not explicitly disabled
                    parents.push(child);
                    if (enable)
                        child->itemFlags = child->itemFlags | Qt::ItemIsEnabled;
                    else
                        child->itemFlags = child->itemFlags & ~Qt::ItemIsEnabled;
                    child->itemChanged(); // ### we may want to optimize this
                }
            }
        }
    }
    itemChanged();
}